

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
mxx::scatter<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *msgs,size_t size,
                 int root,comm *comm)

{
  allocator_type local_29;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,size,&local_29);
  scatter<int>(msgs,size,
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter(const T* msgs, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result(size);
    scatter(msgs, size, &result[0], root, comm);
    return result;
}